

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O2

Index __thiscall
ObservationModelDiscrete::SampleJointObservation
          (ObservationModelDiscrete *this,Index jaI,Index sucI)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  iVar1 = rand();
  uVar2 = 0;
  dVar3 = 0.0;
  while( true ) {
    if (this->_m_nrJointObservations <= (int)uVar2) {
      return 0;
    }
    dVar4 = dVar3;
    (*(this->super_ObservationModelDiscreteInterface).super_ObservationModel._vptr_ObservationModel
      [4])(this,jaI,(ulong)sucI,(ulong)uVar2);
    dVar3 = dVar3 + dVar4;
    if ((double)iVar1 * 4.656612873077393e-10 <= dVar3) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

Index ObservationModelDiscrete::SampleJointObservation(Index jaI, Index sucI)
{
    double randNr=rand() / (RAND_MAX + 1.0);

    double sum=0;
    Index jo=0;
    int i;
    
    for(i=0;i<_m_nrJointObservations;i++)
    {
        sum+=Get(jaI,sucI,i);
        if(randNr<=sum)
        {
            jo=i;
            break;
        }
    }
    
    return(jo);
}